

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_x_pjs18.c
# Opt level: O0

void lc_tmlyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_type *in_RSI;
  xc_func_type *in_RDI;
  double *ext_params_00;
  double omega;
  
  ext_params_00 = (double *)get_ext_param(in_RDI,(double *)in_RSI,0);
  set_ext_params_lc(in_RSI,ext_params_00);
  xc_func_set_ext_params((xc_func_type *)omega,(double *)in_RDI);
  return;
}

Assistant:

static void lc_tmlyp_set_ext_params(xc_func_type *p, const double *ext_params) {
  double omega;

  omega = get_ext_param(p, ext_params, 0);

  /* 100% long-range exact exchange */
  set_ext_params_lc(p, ext_params);

  /* Set the parameters for js18 */
  xc_func_set_ext_params(p->func_aux[0], &omega);
}